

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout_p.h
# Opt level: O1

void __thiscall
QToolBarAreaLayoutItem::extendSize(QToolBarAreaLayoutItem *this,Orientation o,int extent)

{
  Representation RVar1;
  QSize QVar2;
  QSize QVar3;
  Representation RVar4;
  
  QVar2 = minimumSize(this);
  QVar3 = (QSize)((ulong)QVar2 >> 0x20);
  if (o == Horizontal) {
    QVar3 = QVar2;
  }
  RVar4.m_i = this->preferredSize;
  if (this->preferredSize < 1) {
    QVar2 = sizeHint(this);
    RVar4.m_i = QVar2.ht.m_i.m_i;
    if (o == Horizontal) {
      RVar4.m_i = QVar2.wd.m_i.m_i;
    }
  }
  RVar1.m_i = RVar4.m_i + extent;
  if (RVar4.m_i + extent <= QVar3.wd.m_i.m_i) {
    RVar1.m_i = QVar3.wd.m_i.m_i;
  }
  QVar3 = sizeHint(this);
  RVar4 = QVar3.ht.m_i;
  if (o == Horizontal) {
    RVar4 = QVar3.wd.m_i;
  }
  if (RVar1.m_i == RVar4.m_i) {
    this->preferredSize = -1;
    this->size = RVar4.m_i;
  }
  else {
    this->preferredSize = RVar1.m_i;
  }
  return;
}

Assistant:

void extendSize(Qt::Orientation o, int extent)
    {
        int newSize = qMax(pick(o, minimumSize()), (preferredSize > 0 ? preferredSize : pick(o, sizeHint())) + extent);
        int sizeh = pick(o, sizeHint());
        if (newSize == sizeh) {
            preferredSize = -1;
            size = sizeh;
        } else {
            preferredSize = newSize;
        }
    }